

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O2

void predict_or_learn<false>(LRQFAstate *lrq,single_learner *base,example *ec)

{
  features *this;
  float fVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  int iVar7;
  vw *pvVar8;
  ulong uVar9;
  unsigned_long uVar10;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar11;
  uint uVar12;
  byte *pbVar13;
  features *pfVar14;
  weight *pwVar15;
  ostream *poVar16;
  char *pcVar17;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte *pbVar18;
  uint32_t *puVar19;
  size_type sVar20;
  ulong uVar21;
  uint64_t *puVar22;
  byte *pbVar23;
  size_t *__s;
  byte *pbVar24;
  uint uVar25;
  size_t sVar26;
  uint uVar27;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  bool bVar28;
  ulong local_278;
  char *new_feature;
  char *new_space;
  char *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0 [3];
  stringstream new_feature_buffer;
  ostream local_1a8;
  
  pvVar8 = lrq->all;
  __s = lrq->orig_size;
  memset(__s,0,0x800);
  pbVar18 = (ec->super_example_predict).indices._end;
  for (pbVar13 = (ec->super_example_predict).indices._begin; pbVar13 != pbVar18;
      pbVar13 = pbVar13 + 1) {
    bVar2 = *pbVar13;
    __s[bVar2] = (long)(ec->super_example_predict).feature_space[bVar2].values._end -
                 (long)(ec->super_example_predict).feature_space[bVar2].values._begin >> 2;
  }
  local_278 = ec->example_counter;
  uVar4 = lrq->k;
  bVar28 = (pvVar8->weights).sparse != false;
  puVar22 = &(pvVar8->weights).dense_weights._weight_mask;
  if (bVar28) {
    puVar22 = &(pvVar8->weights).sparse_weights._weight_mask;
  }
  uVar9 = *puVar22;
  puVar19 = &(pvVar8->weights).dense_weights._stride_shift;
  if (bVar28) {
    puVar19 = &(pvVar8->weights).sparse_weights._stride_shift;
  }
  uVar5 = *puVar19;
  bVar28 = true;
  while (bVar28) {
    pbVar13 = (byte *)(lrq->field_name)._M_dataplus._M_p;
    sVar20 = (lrq->field_name)._M_string_length;
    pbVar18 = pbVar13;
    while (pbVar23 = pbVar18, pbVar23 != pbVar13 + sVar20) {
      for (pbVar24 = pbVar23 + 1; pbVar18 = pbVar23 + 1, pbVar24 != pbVar13 + sVar20;
          pbVar24 = pbVar24 + 1) {
        pbVar18 = pbVar24;
        pbVar13 = pbVar23;
        if ((local_278 & 1) == 0) {
          pbVar18 = pbVar23;
          pbVar13 = pbVar24;
        }
        bVar2 = *pbVar13;
        bVar3 = *pbVar18;
        pfVar14 = (ec->super_example_predict).feature_space + bVar2;
        iVar6 = lrq->field_id[bVar3];
        this = (ec->super_example_predict).feature_space + bVar3;
        iVar7 = lrq->field_id[bVar2];
        this_01 = &(ec->super_example_predict).feature_space[bVar3].space_names;
        for (uVar12 = 0; uVar21 = (ulong)uVar12, uVar21 < __s[bVar2]; uVar12 = uVar12 + 1) {
          fVar1 = (pfVar14->values)._begin[uVar21];
          uVar10 = (pfVar14->indicies)._begin[uVar21];
          for (uVar27 = 1; uVar27 <= uVar4; uVar27 = uVar27 + 1) {
            pwVar15 = parameters::operator[]
                                (&pvVar8->weights,
                                 ((ulong)(uVar27 + iVar6 * uVar4) << ((byte)uVar5 & 0x3f)) + uVar10
                                 & uVar9);
            uVar25 = 0;
            while( true ) {
              uVar21 = (ulong)uVar25;
              if (__s[bVar3] <= uVar21) break;
              features::push_back(this,*pwVar15 * fVar1 * (this->values)._begin[uVar21],
                                  (this->indicies)._begin[uVar21] +
                                  ((ulong)(uVar27 + iVar7 * uVar4) << ((byte)uVar5 & 0x3f)));
              if ((pvVar8->audit != false) || (pvVar8->hash_inv == true)) {
                std::__cxx11::stringstream::stringstream((stringstream *)&new_feature_buffer);
                poVar16 = std::operator<<(&local_1a8,bVar3);
                poVar16 = std::operator<<(poVar16,'^');
                poVar16 = std::operator<<(poVar16,(string *)
                                                  &(this_01->_begin[uVar21].
                                                                                                        
                                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_ptr)->second);
                poVar16 = std::operator<<(poVar16,'^');
                std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
                new_space = strdup("lrqfa");
                std::__cxx11::stringbuf::str();
                pcVar17 = strdup(local_1d8);
                std::__cxx11::string::~string((string *)&local_1d8);
                new_feature = pcVar17;
                this_00 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)operator_new(0x40);
                std::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::pair<char_*&,_char_*&,_true>(this_00,&new_space,&new_feature);
                std::
                __shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,void>
                          ((__shared_ptr<std::pair<std::__cxx11::string,std::__cxx11::string>,(__gnu_cxx::_Lock_policy)2>
                            *)&local_1d8,this_00);
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back(this_01,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)&local_1d8);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_1d0);
                std::__cxx11::stringstream::~stringstream((stringstream *)&new_feature_buffer);
              }
              uVar25 = uVar25 + 1;
            }
          }
        }
        pbVar13 = (byte *)(lrq->field_name)._M_dataplus._M_p;
        sVar20 = (lrq->field_name)._M_string_length;
      }
    }
    LEARNER::learner<char,_example>::predict(base,ec,0);
    pbVar13 = (byte *)(lrq->field_name)._M_dataplus._M_p;
    pbVar18 = pbVar13 + (lrq->field_name)._M_string_length;
    for (; pbVar13 != pbVar18; pbVar13 = pbVar13 + 1) {
      bVar2 = *pbVar13;
      (ec->super_example_predict).feature_space[bVar2].values._end =
           (ec->super_example_predict).feature_space[bVar2].values._begin + __s[bVar2];
      if ((pvVar8->audit != false) || (pvVar8->hash_inv == true)) {
        sVar26 = __s[bVar2];
        uVar21 = sVar26 << 4 | 8;
        for (; psVar11 = (ec->super_example_predict).feature_space[bVar2].space_names._begin,
            sVar26 < (ulong)((long)(ec->super_example_predict).feature_space[bVar2].space_names._end
                             - (long)psVar11 >> 4); sVar26 = sVar26 + 1) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&(psVar11->
                             super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr + uVar21));
          uVar21 = uVar21 + 0x10;
        }
        (ec->super_example_predict).feature_space[bVar2].space_names._end = psVar11 + __s[bVar2];
      }
    }
    local_278 = local_278 + 1;
    bVar28 = false;
  }
  return;
}

Assistant:

void predict_or_learn(LRQFAstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices) lrq.orig_size[i] = ec.feature_space[i].size();

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;
  unsigned int k = lrq.k;
  float sqrtk = (float)sqrt(k);

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  uint64_t weight_mask = lrq.all->weights.mask();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa

    for (string::const_iterator i1 = lrq.field_name.begin(); i1 != lrq.field_name.end(); ++i1)
    {
      for (string::const_iterator i2 = i1 + 1; i2 != lrq.field_name.end(); ++i2)
      {
        unsigned char left = (which % 2) ? *i1 : *i2;
        unsigned char right = ((which + 1) % 2) ? *i1 : *i2;
        unsigned int lfd_id = lrq.field_id[left];
        unsigned int rfd_id = lrq.field_id[right];
        for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
        {
          features& fs = ec.feature_space[left];
          float lfx = fs.values[lfn];
          uint64_t lindex = fs.indicies[lfn];
          for (unsigned int n = 1; n <= k; ++n)
          {
            uint64_t lwindex =
                (lindex + ((uint64_t)(rfd_id * k + n) << stride_shift));  // a feature has k weights in each field
            float* lw = &all.weights[lwindex & weight_mask];
            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex) * 0.5f / sqrtk;

            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              features& rfs = ec.feature_space[right];
              //                    feature* rf = ec.atomics[right].begin + rfn;
              // NB: ec.ft_offset added by base learner
              float rfx = rfs.values[rfn];
              uint64_t rindex = rfs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)(lfd_id * k + n) << stride_shift));

              rfs.push_back(*lw * lfx * rfx, rwindex);
              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << rfs.space_names[rfn].get()->second << '^' << n;
#ifdef _WIN32
                char* new_space = _strdup("lrqfa");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrqfa");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                rfs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
    }

    for (char i : lrq.field_name)
    {
      namespace_index right = i;
      features& rfs = ec.feature_space[right];
      rfs.values.end() = rfs.values.begin() + lrq.orig_size[right];

      if (all.audit || all.hash_inv)
      {
        for (size_t j = lrq.orig_size[right]; j < rfs.space_names.size(); ++j) rfs.space_names[j].~audit_strings_ptr();

        rfs.space_names.end() = rfs.space_names.begin() + lrq.orig_size[right];
      }
    }
  }
}